

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O0

void Eigen::internal::colamd_set_defaults(double *knobs)

{
  int local_14;
  int i;
  double *knobs_local;
  
  if (knobs != (double *)0x0) {
    for (local_14 = 0; local_14 < 0x14; local_14 = local_14 + 1) {
      knobs[local_14] = 0.0;
    }
    *knobs = 0.5;
    knobs[1] = 0.5;
  }
  return;
}

Assistant:

static inline void colamd_set_defaults(double knobs[COLAMD_KNOBS])
{
  /* === Local variables ================================================== */
  
  int i ;

  if (!knobs)
  {
    return ;      /* no knobs to initialize */
  }
  for (i = 0 ; i < COLAMD_KNOBS ; i++)
  {
    knobs [i] = 0 ;
  }
  knobs [COLAMD_DENSE_ROW] = 0.5 ;  /* ignore rows over 50% dense */
  knobs [COLAMD_DENSE_COL] = 0.5 ;  /* ignore columns over 50% dense */
}